

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::set_inc_term_func(raft_server *this,inc_term_func *func)

{
  element_type *peVar1;
  unique_lock<std::recursive_mutex> guard;
  unique_lock<std::recursive_mutex> local_40;
  function<unsigned_long_(unsigned_long)> local_30;
  
  std::unique_lock<std::recursive_mutex>::unique_lock(&local_40,&this->lock_);
  peVar1 = (this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    std::function<unsigned_long_(unsigned_long)>::function(&local_30,func);
    std::function<unsigned_long_(unsigned_long)>::operator=(&peVar1->inc_term_cb_,&local_30);
    std::_Function_base::~_Function_base(&local_30.super__Function_base);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void raft_server::set_inc_term_func(srv_state::inc_term_func func) {
    recur_lock(lock_);
    if (!state_) return;
    state_->set_inc_term_func(func);
}